

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Range_Normalize(CPpmd7z_RangeDec *p)

{
  UInt32 UVar1;
  byte bVar2;
  CPpmd7z_RangeDec *p_local;
  
  do {
    if (0xffffff < (p->Low ^ p->Low + p->Range)) {
      if (p->Bottom <= p->Range) {
        return;
      }
      p->Range = -p->Low & p->Bottom - 1;
    }
    UVar1 = p->Code;
    bVar2 = (*p->Stream->Read)(p->Stream);
    p->Code = UVar1 << 8 | (uint)bVar2;
    p->Range = p->Range << 8;
    p->Low = p->Low << 8;
  } while( true );
}

Assistant:

static void Range_Normalize(CPpmd7z_RangeDec *p)
{
  while (1)
  {
    if((p->Low ^ (p->Low + p->Range)) >= kTopValue)
    {
      if(p->Range >= p->Bottom)
        break;
      else
        p->Range = ((uint32_t)(-(int32_t)p->Low)) & (p->Bottom - 1);
    }
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}